

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O1

void __thiscall geometrycentral::surface::SurfaceMesh::deleteElement(SurfaceMesh *this,Edge e)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->useImplicitTwinFlag != true) {
    (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start
    [e.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind] =
         0xffffffffffffffff;
    this->nEdgesCount = this->nEdgesCount - 1;
    this->modificationTick = this->modificationTick + 1;
    this->isCompressedFlag = false;
    return;
  }
  this_00 = (runtime_error *)
            __cxa_allocate_exception
                      (0x10,e.
                            super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>
                            .mesh);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/surface_mesh.cpp"
             ,"");
  ::std::operator+(&local_70,"GC_SAFETY_ASSERT FAILURE from ",&local_b0);
  plVar1 = (long *)::std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar2) {
    local_f0.field_2._M_allocated_capacity = *psVar2;
    local_f0.field_2._8_8_ = plVar1[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar2;
  }
  local_f0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  ::std::__cxx11::to_string(&local_90,0x68c);
  ::std::operator+(&local_50,&local_f0,&local_90);
  plVar1 = (long *)::std::__cxx11::string::append((char *)&local_50);
  local_d0 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_d0 == plVar3) {
    local_c0 = *plVar3;
    lStack_b8 = plVar1[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *plVar3;
  }
  local_c8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)::std::__cxx11::string::append((char *)&local_d0);
  local_110 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_110 == plVar3) {
    local_100 = *plVar3;
    lStack_f8 = plVar1[3];
    local_110 = &local_100;
  }
  else {
    local_100 = *plVar3;
  }
  local_108 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  ::std::runtime_error::runtime_error(this_00,(string *)&local_110);
  __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SurfaceMesh::deleteElement(Edge e) {
  GC_SAFETY_ASSERT(!usesImplicitTwin(), "cannot delete a single edge with implict twin");

  size_t i = e.getIndex();
  eHalfedgeArr[e.getIndex()] = INVALID_IND;
  nEdgesCount--;

  modificationTick++;
  isCompressedFlag = false;
}